

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O3

void __thiscall
ExprTest_EqualLogicalCountExpr_Test::~ExprTest_EqualLogicalCountExpr_Test
          (ExprTest_EqualLogicalCountExpr_Test *this)

{
  (this->super_ExprTest).super_Test._vptr_Test = (_func_int **)&PTR__ExprTest_001a4a58;
  mp::BasicExprFactory<std::allocator<char>_>::~BasicExprFactory(&(this->super_ExprTest).factory_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x58);
  return;
}

Assistant:

TEST_F(ExprTest, EqualLogicalCountExpr) {
  auto n0 = MakeConst(0), n1 = MakeConst(1);
  LogicalExpr args[] = {l0};
  auto count = MakeCount(args);
  EXPECT_TRUE(Equal(factory_.MakeLogicalCount(expr::ATMOST, n0, count),
                    factory_.MakeLogicalCount(expr::ATMOST, n0, count)));
  EXPECT_FALSE(Equal(factory_.MakeLogicalCount(expr::ATMOST, n0, count),
                     factory_.MakeLogicalCount(expr::ATMOST, n1, count)));
}